

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdantzigpr.hpp
# Opt level: O0

SPxId __thiscall
soplex::
SPxDantzigPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterX(SPxDantzigPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this)

{
  bool bVar1;
  type_conflict5 tVar2;
  cpp_dec_float<200U,_int,_void> *in_RDI;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  bestCo;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  best;
  SPxId enterIdCo;
  SPxId enterId;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  undefined6 in_stack_fffffffffffffc68;
  undefined1 in_stack_fffffffffffffc6e;
  undefined1 in_stack_fffffffffffffc6f;
  byte bVar3;
  undefined8 local_388;
  undefined1 local_380 [128];
  DataKey local_300;
  DataKey local_2f8;
  undefined1 local_2f0 [112];
  SPxId *in_stack_fffffffffffffd80;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffd88;
  SPxDantzigPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffd90;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1f0;
  undefined1 local_170 [128];
  DataKey local_f0;
  DataKey local_e8 [2];
  DataKey local_d8;
  undefined1 *local_d0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c8;
  undefined1 *local_c0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_99;
  uint *local_98;
  undefined1 *local_90;
  uint *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_69;
  uint *local_68;
  undefined1 *local_60;
  uint *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  undefined8 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  SPxId::SPxId((SPxId *)0x777ba9);
  SPxId::SPxId((SPxId *)0x777bb6);
  local_d0 = local_170;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(in_RDI);
  local_c8 = &local_1f0;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(in_RDI);
  local_68 = (in_RDI->data)._M_elems + 6;
  local_60 = &stack0xfffffffffffffd90;
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_69,
             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_68);
  local_50 = &stack0xfffffffffffffd90;
  local_58 = local_68;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (in_RDI,(cpp_dec_float<200U,_int,_void> *)
                    CONCAT17(in_stack_fffffffffffffc6f,
                             CONCAT16(in_stack_fffffffffffffc6e,in_stack_fffffffffffffc68)));
  local_48 = &stack0xfffffffffffffd90;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate(in_RDI);
  local_a8 = local_170;
  local_b0 = &stack0xfffffffffffffd90;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            (in_RDI,(cpp_dec_float<200U,_int,_void> *)
                    CONCAT17(in_stack_fffffffffffffc6f,
                             CONCAT16(in_stack_fffffffffffffc6e,in_stack_fffffffffffffc68)));
  local_98 = (in_RDI->data)._M_elems + 6;
  local_90 = local_2f0;
  boost::multiprecision::detail::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  ::
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&local_99,
             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_98);
  local_80 = local_2f0;
  local_88 = local_98;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (in_RDI,(cpp_dec_float<200U,_int,_void> *)
                    CONCAT17(in_stack_fffffffffffffc6f,
                             CONCAT16(in_stack_fffffffffffffc6e,in_stack_fffffffffffffc68)));
  local_78 = local_2f0;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::negate(in_RDI);
  local_b8 = &local_1f0;
  local_c0 = local_2f0;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            (in_RDI,(cpp_dec_float<200U,_int,_void> *)
                    CONCAT17(in_stack_fffffffffffffc6f,
                             CONCAT16(in_stack_fffffffffffffc6e,in_stack_fffffffffffffc68)));
  if ((*(byte *)(*(long *)((in_RDI->data)._M_elems + 4) + 0x1431) & 1) == 0) {
    local_2f8 = (DataKey)selectEnterDenseDim(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                                             in_stack_fffffffffffffd80);
  }
  else {
    local_2f8 = (DataKey)selectEnterSparseDim
                                   (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                                    in_stack_fffffffffffffd80);
  }
  local_e8[0] = local_2f8;
  if ((*(byte *)(*(long *)((in_RDI->data)._M_elems + 4) + 0x1432) & 1) == 0) {
    local_300 = (DataKey)selectEnterDenseCoDim
                                   (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                                    in_stack_fffffffffffffd80);
  }
  else {
    local_300 = (DataKey)selectEnterSparseCoDim
                                   (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                                    in_stack_fffffffffffffd80);
  }
  local_f0 = local_300;
  bVar1 = SPxId::isValid((SPxId *)local_e8);
  bVar3 = 0;
  if (bVar1) {
    local_388 = 0x3fe999999999999a;
    local_28 = local_380;
    local_30 = &local_388;
    local_38 = &local_1f0;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_39,local_38);
    local_20 = local_380;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float(in_RDI);
    local_10 = local_380;
    local_18 = local_38;
    local_8 = local_30;
    boost::multiprecision::default_ops::
    eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
              (in_RDI,(cpp_dec_float<200U,_int,_void> *)
                      CONCAT17(bVar3,CONCAT16(in_stack_fffffffffffffc6e,in_stack_fffffffffffffc68)),
               (double *)0x777f0a);
    tVar2 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT17(bVar3,CONCAT16(in_stack_fffffffffffffc6e,
                                                  in_stack_fffffffffffffc68)),
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x777f1c);
    bVar3 = 1;
    if (!tVar2) {
      bVar1 = SPxId::isValid((SPxId *)&local_f0);
      bVar3 = bVar1 ^ 0xff;
    }
  }
  if ((bVar3 & 1) == 0) {
    local_d8 = local_f0;
  }
  else {
    local_d8 = local_e8[0];
  }
  return (SPxId)local_d8;
}

Assistant:

SPxId SPxDantzigPR<R>::selectEnterX()
{
   SPxId enterId;
   SPxId enterIdCo;
   R best;
   R bestCo;

   best = -this->thetolerance;
   bestCo = -this->thetolerance;
   enterId = (this->thesolver->sparsePricingEnter) ? selectEnterSparseDim(best,
             enterId) : selectEnterDenseDim(best, enterId);
   enterIdCo = (this->thesolver->sparsePricingEnterCo) ? selectEnterSparseCoDim(bestCo,
               enterId) : selectEnterDenseCoDim(bestCo, enterId);

   // prefer slack indices to reduce nonzeros in basis matrix
   if(enterId.isValid() && (best > SOPLEX_SPARSITY_TRADEOFF * bestCo || !enterIdCo.isValid()))
      return enterId;
   else
      return enterIdCo;
}